

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BplusTree.hpp
# Opt level: O3

void __thiscall
sjtu::
BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
::erasenonleaf(BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
               *this,int *cur,node **p,int *pp,locType *pos)

{
  locType *plVar1;
  int iVar2;
  node *pnVar3;
  locType *plVar4;
  BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
  *pBVar5;
  int iVar6;
  long lVar7;
  _func_int *UNRECOVERED_JUMPTABLE;
  undefined4 extraout_var;
  node *pnVar8;
  undefined8 *puVar9;
  int iVar10;
  node *pnVar11;
  undefined8 *puVar12;
  uint uVar13;
  long lVar14;
  long lVar15;
  DynamicFileManager<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
  *pDVar16;
  int iVar17;
  long lVar18;
  ulong uVar19;
  undefined8 *puVar20;
  int *piVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  undefined8 uStack_80;
  unsigned_long_long uStack_78;
  undefined8 uStack_70;
  locType *local_68;
  undefined1 *local_60;
  ulong local_58;
  BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
  *local_50;
  int *local_48;
  int *local_40;
  uint local_34;
  undefined4 extraout_var_00;
  
  iVar10 = *cur;
  iVar17 = pp[iVar10];
  pnVar8 = p[iVar10];
  iVar6 = pnVar8->sz;
  if (iVar17 + 1 < iVar6) {
    lVar7 = (long)iVar17 + 1;
    lVar18 = (long)iVar17 * 0x10 + 0x340;
    do {
      *(undefined8 *)((long)pnVar8 + lVar18 + -0x18) = *(undefined8 *)((long)pnVar8 + lVar18 + -8);
      *(undefined4 *)((long)pnVar8 + lVar18 + -0x10) =
           *(undefined4 *)((long)&pnVar8->field_0 + lVar18);
      (pnVar8->field_0).val[lVar7] = *(long *)((long)&pnVar8->field_0 + lVar7 * 8 + 8);
      lVar7 = lVar7 + 1;
      pnVar8 = p[iVar10];
      iVar6 = pnVar8->sz;
      lVar18 = lVar18 + 0x10;
    } while (lVar7 < iVar6);
  }
  pnVar8->sz = iVar6 + -1;
  lVar7 = (long)*cur;
  if (lVar7 == 0) {
    if (iVar6 + -1 == 0) {
      this->depth = this->depth + -1;
      uStack_80 = 0x113b64;
      DynamicFileManager<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
      ::release(this->file,this->root);
      this->root = pos[1];
      return;
    }
    pDVar16 = this->file;
    UNRECOVERED_JUMPTABLE =
         (pDVar16->
         super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
         )._vptr_FileManager_Base[3];
  }
  else {
    if (iVar6 < 0x32) {
      iVar17 = pp[lVar7 + -1];
      local_40 = pp;
      if (iVar17 == p[lVar7 + -1]->sz) {
        p[lVar7 + 1] = p[lVar7];
        pp[lVar7 + 1] = iVar17;
        lVar7 = (long)*cur;
        pos[lVar7 + 1] = pos[lVar7];
        pp[lVar7 + -1] = p[lVar7 + -1]->sz + -1;
        lVar7 = (long)*cur;
        pos[lVar7] = (p[lVar7 + -1]->field_0).val[pp[lVar7 + -1]];
        uStack_80 = 0x113887;
        iVar6 = (*(this->file->
                  super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
                  )._vptr_FileManager_Base[2])();
        iVar17 = *cur;
        lVar7 = (long)iVar17;
        p[lVar7] = (node *)CONCAT44(extraout_var,iVar6);
        pnVar8 = p[lVar7 + 1];
      }
      else {
        pp[lVar7 + 1] = iVar17 + 1;
        lVar7 = (long)*cur;
        pos[lVar7 + 1] = (p[lVar7 + -1]->field_0).val[pp[lVar7 + 1]];
        uStack_80 = 0x1138c3;
        iVar17 = (*(this->file->
                   super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
                   )._vptr_FileManager_Base[2])();
        pnVar8 = (node *)CONCAT44(extraout_var_00,iVar17);
        iVar17 = *cur;
        lVar7 = (long)iVar17;
        p[lVar7 + 1] = pnVar8;
      }
      pnVar11 = p[iVar10];
      iVar6 = pnVar11->sz;
      iVar2 = pnVar8->sz;
      uVar13 = iVar2 + iVar6;
      if ((int)uVar13 < 99) {
        pnVar3 = p[(long)iVar17 + -1];
        iVar17 = local_40[(long)iVar17 + -1];
        pnVar11->keyvalue[iVar6].first = pnVar3->keyvalue[iVar17].first;
        pnVar11->keyvalue[iVar6].second = pnVar3->keyvalue[iVar17].second;
        if (iVar2 < 1) {
          lVar18 = (long)iVar2;
        }
        else {
          lVar14 = 0x66;
          lVar23 = 0;
          do {
            (pnVar11->field_0).val[iVar6 + (int)lVar23 + 1] = (pnVar8->field_0).val[lVar23];
            pnVar11 = p[iVar10];
            iVar6 = pnVar11->sz;
            iVar17 = (int)lVar23 + 1 + iVar6;
            lVar23 = lVar23 + 1;
            pnVar8 = p[lVar7 + 1];
            pnVar11->keyvalue[iVar17].first =
                 *(unsigned_long_long *)((long)pnVar8 + lVar14 * 8 + -8);
            pnVar11->keyvalue[iVar17].second = *(int *)((long)&pnVar8->field_0 + lVar14 * 8);
            iVar2 = pnVar8->sz;
            lVar18 = (long)iVar2;
            lVar14 = lVar14 + 2;
          } while (lVar23 < lVar18);
        }
        lVar7 = (pnVar8->field_0).val[lVar18];
        iVar10 = iVar2 + iVar6 + 1;
        pnVar11->sz = iVar10;
        (pnVar11->field_0).val[iVar10] = lVar7;
        uStack_80 = 0x113b9d;
        (*(this->file->
          super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
          )._vptr_FileManager_Base[3])(this->file,pos + *cur);
        uStack_80 = 0x113baf;
        DynamicFileManager<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
        ::release(this->file,pos[(long)*cur + 1]);
        uStack_70._4_4_ = *cur + -1;
        uStack_80 = 0x113bcd;
        erasenonleaf(this,(int *)((long)&uStack_70 + 4),p,local_40,pos);
      }
      else {
        local_68 = pos;
        local_60 = (undefined1 *)&uStack_78;
        uVar19 = (ulong)uVar13;
        lVar18 = -(uVar19 * 8 + 0x1f & 0xfffffffffffffff0);
        puVar9 = (undefined8 *)((long)&uStack_78 + lVar18);
        local_58 = uVar19 + 1;
        puVar12 = puVar9 + (uVar19 + 1) * -2;
        puVar20 = puVar12;
        do {
          *puVar20 = 0;
          *(undefined4 *)(puVar20 + 1) = 0;
          puVar20 = puVar20 + 2;
        } while (puVar20 != puVar9);
        local_34 = uVar13;
        local_50 = this;
        pnVar8 = p[iVar10];
        iVar17 = pnVar8->sz;
        lVar23 = (long)iVar17;
        if (0 < lVar23) {
          lVar14 = 0;
          do {
            *(undefined8 *)((long)puVar9 + lVar14) =
                 *(undefined8 *)((long)&pnVar8->field_0 + lVar14);
            *(undefined8 *)((long)puVar12 + lVar14 * 2) =
                 *(undefined8 *)((long)&pnVar8->keyvalue[0].first + lVar14 * 2);
            *(undefined4 *)((long)puVar12 + lVar14 * 2 + 8) =
                 *(undefined4 *)((long)&pnVar8->keyvalue[0].second + lVar14 * 2);
            lVar14 = lVar14 + 8;
          } while (lVar23 * 8 - lVar14 != 0);
        }
        puVar9[lVar23] = (pnVar8->field_0).val[lVar23];
        local_48 = cur;
        pnVar11 = p[(long)*cur + -1];
        iVar6 = local_40[(long)*cur + -1];
        puVar12[lVar23 * 2] = pnVar11->keyvalue[iVar6].first;
        *(int *)(puVar12 + lVar23 * 2 + 1) = pnVar11->keyvalue[iVar6].second;
        pnVar11 = p[lVar7 + 1];
        if (iVar17 < (int)local_34) {
          piVar21 = (int *)(puVar12 + lVar23 * 2 + 3);
          lVar14 = 0;
          do {
            iVar17 = (int)lVar14;
            puVar9[lVar23 + lVar14 + 1] = (pnVar11->field_0).val[iVar17];
            *(unsigned_long_long *)(piVar21 + -2) = pnVar11->keyvalue[iVar17].first;
            *piVar21 = pnVar11->keyvalue[iVar17].second;
            lVar14 = lVar14 + 1;
            piVar21 = piVar21 + 4;
          } while (uVar19 - lVar23 != lVar14);
        }
        uVar19 = local_58;
        lVar23 = (pnVar11->field_0).val[pnVar11->sz];
        puVar9[local_58] = lVar23;
        piVar21 = local_48;
        pBVar5 = local_50;
        plVar4 = local_68;
        uVar13 = (uint)(uVar19 >> 1) & 0x7fffffff;
        pnVar8->sz = uVar13;
        pnVar11->sz = local_34 - uVar13;
        lVar14 = (long)pnVar8->sz;
        if (0 < lVar14) {
          lVar15 = 0;
          lVar22 = 0;
          do {
            (pnVar8->field_0).val[lVar22] = puVar9[lVar22];
            pnVar8 = p[iVar10];
            *(undefined8 *)((long)&pnVar8->keyvalue[0].first + lVar15) =
                 *(undefined8 *)((long)puVar12 + lVar15);
            *(undefined4 *)((long)&pnVar8->keyvalue[0].second + lVar15) =
                 *(undefined4 *)((long)puVar12 + lVar15 + 8);
            lVar22 = lVar22 + 1;
            lVar14 = (long)pnVar8->sz;
            lVar15 = lVar15 + 0x10;
          } while (lVar22 < lVar14);
        }
        (pnVar8->field_0).val[lVar14] = puVar9[lVar14];
        lVar14 = (long)p[iVar10]->sz;
        pnVar8 = p[(long)*local_48 + -1];
        iVar17 = local_40[(long)*local_48 + -1];
        pnVar8->keyvalue[iVar17].first = puVar12[lVar14 * 2];
        pnVar8->keyvalue[iVar17].second = *(int *)(puVar12 + lVar14 * 2 + 1);
        pnVar8 = p[lVar7 + 1];
        lVar15 = (long)pnVar8->sz;
        if (0 < lVar15) {
          lVar22 = 0x66;
          lVar24 = 0;
          do {
            (pnVar8->field_0).val[lVar24] =
                 *(long *)((long)&uStack_70 + ((int)lVar14 + lVar24) * 8 + lVar18);
            lVar14 = (long)p[iVar10]->sz;
            pnVar8 = p[lVar7 + 1];
            *(undefined8 *)((long)pnVar8 + lVar22 * 8 + -8) = puVar12[(lVar14 + lVar24) * 2 + 2];
            *(undefined4 *)((long)&pnVar8->field_0 + lVar22 * 8) =
                 *(undefined4 *)(puVar12 + (lVar14 + lVar24) * 2 + 3);
            lVar24 = lVar24 + 1;
            lVar15 = (long)pnVar8->sz;
            lVar22 = lVar22 + 2;
          } while (lVar24 < lVar15);
        }
        (pnVar8->field_0).val[lVar15] = lVar23;
        pDVar16 = local_50->file;
        plVar1 = local_68 + *local_48;
        UNRECOVERED_JUMPTABLE =
             (pDVar16->
             super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
             )._vptr_FileManager_Base[3];
        puVar12[-1] = 0x113ca5;
        (*UNRECOVERED_JUMPTABLE)(pDVar16,plVar1);
        pDVar16 = pBVar5->file;
        iVar10 = *piVar21;
        UNRECOVERED_JUMPTABLE =
             (pDVar16->
             super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
             )._vptr_FileManager_Base[3];
        puVar12[-1] = 0x113cbb;
        (*UNRECOVERED_JUMPTABLE)(pDVar16,plVar4 + (long)iVar10 + 1);
        pDVar16 = pBVar5->file;
        iVar10 = *piVar21;
        UNRECOVERED_JUMPTABLE =
             (pDVar16->
             super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
             )._vptr_FileManager_Base[3];
        puVar12[-1] = 0x113cd1;
        (*UNRECOVERED_JUMPTABLE)(pDVar16,plVar4 + (long)iVar10 + -1);
      }
      return;
    }
    pDVar16 = this->file;
    pos = pos + lVar7;
    UNRECOVERED_JUMPTABLE =
         (pDVar16->
         super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
         )._vptr_FileManager_Base[3];
  }
  (*UNRECOVERED_JUMPTABLE)(pDVar16,pos);
  return;
}

Assistant:

void erasenonleaf(const int &cur, node **p, int *pp, locType *pos) {
            node *&x = p[cur];
            int i, j = pp[cur];
            for (i = j + 1; i < x->sz; ++i)x->keyvalue[i - 1] = x->keyvalue[i], x->pointer[i] = x->pointer[i + 1];
            --x->sz;
            if (!cur) {
                if (!x->sz) {
                    --depth;
                    file->release(root);
                    root = pos[1];
                } else {
                    file->save(pos[0]);
                }
                return;
            }
            if (x->sz >= degree - 1 >> 1) {
                file->save(pos[cur]);
                return;
            }
            if (pp[cur - 1] == p[cur - 1]->sz) {
                p[cur + 1] = p[cur];
                pp[cur + 1] = pp[cur - 1];
                pos[cur + 1] = pos[cur];
                pp[cur - 1] = p[cur - 1]->sz - 1;
                pos[cur] = p[cur - 1]->pointer[pp[cur - 1]];
                p[cur] = file->read(pos[cur]);
            } else {
                pp[cur + 1] = pp[cur - 1] + 1;
                pos[cur + 1] = p[cur - 1]->pointer[pp[cur + 1]];
                p[cur + 1] = file->read(pos[cur + 1]);
            }
            node *&y = p[cur + 1];
            if (x->sz + y->sz < degree - 1) {
                x->keyvalue[x->sz] = p[cur - 1]->keyvalue[pp[cur - 1]];
                for (i = 0; i < y->sz; ++i)
                    x->pointer[x->sz + 1 + i] = y->pointer[i], x->keyvalue[x->sz + 1 + i] = y->keyvalue[i];
                x->pointer[x->sz += 1 + y->sz] = y->pointer[y->sz];
                file->save(pos[cur]);
                file->release(pos[cur + 1]);
                erasenonleaf(cur - 1, p, pp, pos);
            } else {
                int newsz = x->sz + y->sz + 1;
                locType tmpp[newsz + 1];
                Key tmpk[newsz], old = y->keyvalue[0];
                for (i = 0; i < x->sz; ++i)tmpp[i] = x->pointer[i], tmpk[i] = x->keyvalue[i];
                tmpp[x->sz] = x->pointer[x->sz];
                tmpk[x->sz] = p[cur - 1]->keyvalue[pp[cur - 1]];
                for (i = x->sz + 1; i < newsz; ++i)
                    tmpp[i] = y->pointer[i - x->sz - 1], tmpk[i] = y->keyvalue[i - x->sz - 1];
                tmpp[newsz] = y->pointer[y->sz];
                x->sz = newsz >> 1;
                y->sz = newsz - x->sz - 1;
                for (i = 0; i < x->sz; ++i)x->pointer[i] = tmpp[i], x->keyvalue[i] = tmpk[i];
                x->pointer[x->sz] = tmpp[x->sz];
                p[cur - 1]->keyvalue[pp[cur - 1]] = tmpk[x->sz];
                for (i = 0; i < y->sz; ++i)y->pointer[i] = tmpp[i + x->sz + 1], y->keyvalue[i] = tmpk[i + x->sz + 1];
                y->pointer[y->sz] = tmpp[newsz];
                file->save(pos[cur]);
                file->save(pos[cur + 1]);
                file->save(pos[cur - 1]);
            }
        }